

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.h
# Opt level: O0

void __thiscall CLI::detail::PositiveNumber::PositiveNumber(PositiveNumber *this)

{
  anon_class_1_0_00000001 *in_stack_ffffffffffffffc8;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *in_stack_ffffffffffffffd0;
  string local_28 [8];
  allocator<char> *in_stack_ffffffffffffffe0;
  string *in_stack_ffffffffffffffe8;
  Validator *in_stack_fffffffffffffff0;
  
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffff0,(char *)in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  Validator::Validator(in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
  ::std::__cxx11::string::~string(local_28);
  ::std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffd7);
  ::std::function<std::__cxx11::string(std::__cxx11::string&)>::operator=
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  return;
}

Assistant:

PositiveNumber() : Validator("POSITIVE") {
        func_ = [](std::string &number_str) {
            double number;
            if(!detail::lexical_cast(number_str, number)) {
                return std::string("Failed parsing number: (") + number_str + ')';
            }
            if(number <= 0) {
                return std::string("Number less or equal to 0: (") + number_str + ')';
            }
            return std::string();
        };
    }